

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O1

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType TVar1;
  LiteralType LVar2;
  string_view *this_00;
  Info local_48;
  
  TVar1 = this->token_type_;
  if ((ulong)TVar1 < 0x31) {
    local_48.name = GetTokenTypeName::s_names[TVar1];
    goto LAB_0018c9b4;
  }
  if (TVar1 - First_Literal < 3) {
    this_00 = &(this->field_2).literal_.text;
LAB_0018c9c7:
    string_view::to_string_abi_cxx11_(__return_storage_ptr__,this_00);
    return __return_storage_ptr__;
  }
  if (TVar1 - AtomicFence < 0x3f) {
    Opcode::GetInfo(&local_48,&(this->field_2).opcode_);
    goto LAB_0018c9b4;
  }
  if (TVar1 - AlignEqNat < 6) {
    this_00 = (string_view *)&this->field_2;
    goto LAB_0018c9c7;
  }
  if (2 < TVar1 - First_RefKind) {
    if (3 < TVar1 - First_Type) {
      __assert_fail("HasType()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.cc"
                    ,0x55,"std::string wabt::Token::to_string() const");
    }
    local_48.name = Type::GetName(&(this->field_2).type_);
    goto LAB_0018c9b4;
  }
  LVar2 = (this->field_2).literal_.type;
  if ((int)LVar2 < -0x18) {
    if (LVar2 == 0xffffffde) {
      local_48.name = "array";
      goto LAB_0018c9b4;
    }
    if (LVar2 == 0xffffffdf) {
      local_48.name = "struct";
      goto LAB_0018c9b4;
    }
  }
  else {
    if (LVar2 == 0xffffffe8) {
      local_48.name = "exn";
      goto LAB_0018c9b4;
    }
    if (LVar2 == 0xfffffff0) {
      local_48.name = "func";
      goto LAB_0018c9b4;
    }
    if (LVar2 == 0xffffffef) {
      local_48.name = "extern";
      goto LAB_0018c9b4;
    }
  }
  local_48.name = "<invalid>";
LAB_0018c9b4:
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,local_48.name,(allocator *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return literal_.text.to_string();
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return text_.to_string();
  } else if (IsTokenTypeRefKind(token_type_)) {
    return type_.GetRefKindName();
  } else {
    assert(HasType());
    return type_.GetName();
  }
}